

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O3

double Tunings::locale_atof(char *s)

{
  double result;
  istringstream istr;
  allocator local_1c1;
  double local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  double local_198;
  locale local_190 [8];
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  local_1c0 = 0.0;
  std::__cxx11::string::string((string *)local_1b8,s,&local_1c1);
  std::__cxx11::istringstream::istringstream(local_188,(string *)local_1b8,_S_in);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::locale::locale((locale *)local_1b8,"C");
  std::ios::imbue(local_190);
  std::locale::~locale(local_190);
  std::locale::~locale((locale *)local_1b8);
  std::istream::_M_extract<double>((double *)local_188);
  local_198 = local_1c0;
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return local_198;
}

Assistant:

inline double locale_atof(const char *s)
{
    double result = 0;
    std::istringstream istr(s);
    istr.imbue(std::locale("C"));
    istr >> result;
    return result;
}